

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_lpf1_init(ma_lpf1_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                      ma_lpf1 *pLPF)

{
  bool bVar1;
  ma_result mVar2;
  void *pHeap;
  size_t __size;
  
  mVar2 = MA_INVALID_ARGS;
  if ((pConfig == (ma_lpf1_config *)0x0) || ((ulong)pConfig->channels == 0)) {
    __size = 0;
    bVar1 = false;
  }
  else {
    __size = (ulong)pConfig->channels * 4 + 7 & 0xfffffffffffffff8;
    bVar1 = true;
    mVar2 = MA_SUCCESS;
  }
  if (bVar1) {
    if (__size == 0) {
      pHeap = (void *)0x0;
    }
    else {
      if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
        pHeap = malloc(__size);
      }
      else if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
        pHeap = (void *)0x0;
      }
      else {
        pHeap = (*pAllocationCallbacks->onMalloc)(__size,pAllocationCallbacks->pUserData);
      }
      if (pHeap == (void *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    mVar2 = ma_lpf1_init_preallocated(pConfig,pHeap,pLPF);
    if (mVar2 == MA_SUCCESS) {
      pLPF->_ownsHeap = 1;
      mVar2 = MA_SUCCESS;
    }
    else {
      ma_free(pHeap,pAllocationCallbacks);
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_lpf1_init(const ma_lpf1_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_lpf1* pLPF)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_lpf1_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_lpf1_init_preallocated(pConfig, pHeap, pLPF);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pLPF->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}